

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

bool __thiscall AddressFilter::IsInList(AddressFilter *this,uint8_t *addr,size_t len)

{
  IPAsKey *pIVar1;
  IPAsKey *ret;
  IPAsKey key;
  size_t len_local;
  uint8_t *addr_local;
  AddressFilter *this_local;
  
  key._40_8_ = len;
  IPAsKey::IPAsKey((IPAsKey *)&ret,addr,len);
  pIVar1 = BinHash<IPAsKey>::Retrieve(&this->table,(IPAsKey *)&ret);
  IPAsKey::~IPAsKey((IPAsKey *)&ret);
  return pIVar1 != (IPAsKey *)0x0;
}

Assistant:

bool AddressFilter::IsInList(uint8_t * addr, size_t len)
{
    IPAsKey key(addr, len);
    IPAsKey * ret = table.Retrieve(&key);

    return (ret != NULL);
}